

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSequentialImpulseConstraintSolver.cpp
# Opt level: O0

btScalar __thiscall
btSequentialImpulseConstraintSolver::solveGroupCacheFriendlySetup
          (btSequentialImpulseConstraintSolver *this,btCollisionObject **bodies,int numBodies,
          btPersistentManifold **manifoldPtr,int numManifolds,btTypedConstraint **constraints,
          int numConstraints,btContactSolverInfo *infoGlobal,btIDebugDraw *debugDrawer)

{
  float fVar1;
  long *plVar2;
  undefined8 uVar3;
  btSolverConstraint *this_00;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  btVector3 *pbVar9;
  btRigidBody *pbVar10;
  btConstraintInfo1 *pbVar11;
  int *piVar12;
  undefined8 in_RCX;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  undefined4 in_R8D;
  long in_R9;
  btScalar bVar13;
  btScalar bVar14;
  undefined8 extraout_XMM0_Qb;
  btVector3 bVar15;
  int in_stack_00000008;
  long in_stack_00000010;
  int i_3;
  int numFrictionPool;
  int numConstraintPool;
  int numNonContactPool;
  btScalar velocityImpulse;
  btScalar penetrationImpulse;
  btScalar velocityError;
  btScalar positionalError;
  btScalar restitution;
  btScalar vel2Dotn;
  btScalar vel1Dotn;
  btVector3 externalTorqueImpulseB;
  btVector3 externalForceImpulseB;
  btVector3 externalTorqueImpulseA;
  btVector3 externalForceImpulseA;
  btScalar rel_vel;
  btScalar fsum;
  btScalar sum;
  btVector3 iMJaB;
  btVector3 iMJlB;
  btVector3 iMJaA;
  btVector3 iMJlA;
  btVector3 *ftorqueAxis2;
  btVector3 *ftorqueAxis1;
  btSolverConstraint *solverConstraint;
  btConstraintInfo2 info2;
  int j_1;
  int overrideNumSolverIterations;
  btSolverBody *bodyBPtr;
  btSolverBody *bodyAPtr;
  int solverBodyIdB;
  int solverBodyIdA;
  btRigidBody *rbB;
  btRigidBody *rbA;
  btTypedConstraint *constraint_1;
  btSolverConstraint *currentConstraintRow;
  btConstraintInfo1 *info1_1;
  int currentRow;
  btJointFeedback *fb;
  btConstraintInfo1 *info1;
  int i_2;
  int totalNumRows;
  btTypedConstraint *constraint;
  int j;
  btVector3 gyroForce;
  btSolverBody *solverBody;
  btRigidBody *body;
  int bodyId;
  int i_1;
  int i;
  CProfileSample __profile;
  undefined4 in_stack_fffffffffffff698;
  int in_stack_fffffffffffff69c;
  btSolverBody *in_stack_fffffffffffff6a0;
  undefined4 in_stack_fffffffffffff6a8;
  int in_stack_fffffffffffff6ac;
  btAlignedObjectArray<btSolverBody> *in_stack_fffffffffffff6b0;
  undefined4 in_stack_fffffffffffff6d0;
  undefined4 in_stack_fffffffffffff6d4;
  undefined8 in_stack_fffffffffffff6d8;
  undefined4 in_stack_fffffffffffff6e0;
  undefined4 in_stack_fffffffffffff6e4;
  btScalar local_8c8;
  btScalar bStack_8c4;
  undefined1 in_stack_fffffffffffff768 [16];
  btScalar local_848;
  btScalar bStack_844;
  btScalar local_820;
  btScalar local_7c8;
  btScalar bStack_7c4;
  btScalar local_798;
  btRigidBody *in_stack_fffffffffffff870;
  btScalar local_768;
  btScalar bStack_764;
  undefined1 in_stack_fffffffffffff8b8 [16];
  btSequentialImpulseConstraintSolver *in_stack_fffffffffffff8c8;
  btScalar local_708;
  btScalar bStack_704;
  undefined4 uStack_700;
  undefined4 uStack_6fc;
  btScalar local_6d8;
  btScalar bStack_6d4;
  btScalar local_6a8;
  btScalar bStack_6a4;
  btScalar in_stack_fffffffffffff98c;
  undefined4 in_stack_fffffffffffff990;
  undefined4 in_stack_fffffffffffff994;
  int local_604;
  btScalar local_598;
  btScalar bStack_594;
  btScalar local_568;
  btScalar bStack_564;
  btScalar local_538;
  btScalar bStack_534;
  btScalar local_518;
  btScalar bStack_514;
  btScalar local_4e8;
  btScalar bStack_4e4;
  int local_490;
  btVector3 local_46c;
  btVector3 local_45c;
  float local_44c;
  btVector3 local_448;
  btVector3 local_438;
  float local_428;
  btScalar local_424;
  btScalar local_420;
  btScalar local_41c;
  btVector3 local_418;
  btScalar local_408;
  btScalar local_404;
  btScalar local_400;
  btVector3 local_3fc;
  btScalar local_3ec;
  btScalar local_3e8;
  btScalar local_3e4;
  btVector3 local_3e0;
  btScalar local_3d0;
  btScalar local_3cc;
  btScalar local_3c8;
  btVector3 local_3c4;
  float local_3b4;
  btScalar local_3b0;
  float local_3ac;
  btVector3 local_3a8;
  btScalar local_398;
  btVector3 local_394;
  btVector3 local_384;
  btScalar local_374;
  btVector3 local_370;
  btScalar local_360;
  btScalar bStack_35c;
  undefined8 local_358;
  btScalar local_350;
  btScalar bStack_34c;
  undefined8 uStack_348;
  btVector3 *local_340;
  btScalar local_338;
  btScalar bStack_334;
  undefined8 local_330;
  btScalar local_328;
  btScalar bStack_324;
  undefined8 uStack_320;
  btSolverConstraint *local_318;
  btSolverConstraint *local_310;
  float local_308;
  undefined4 local_304;
  btScalar *local_300;
  btScalar *local_2f8;
  btScalar *local_2f0;
  btScalar *local_2e8;
  undefined4 local_2e0;
  btScalar *local_2d8;
  btScalar *local_2d0;
  btScalar *local_2c8;
  btScalar *local_2c0;
  undefined4 local_2b0;
  float local_2ac;
  btScalar local_2a8;
  btScalar local_2a4;
  btScalar local_2a0;
  btScalar local_29c;
  btScalar local_298;
  btScalar local_294;
  btScalar local_290;
  btScalar local_28c;
  btScalar local_288;
  btScalar local_284;
  btScalar local_280;
  btScalar local_27c;
  btScalar local_278;
  btScalar local_274;
  btScalar local_270;
  btScalar local_26c;
  btScalar local_268;
  btScalar local_264;
  btScalar local_260;
  btScalar local_25c;
  btScalar local_258;
  btScalar local_254;
  btScalar local_250;
  btScalar local_24c;
  int local_248;
  int local_244;
  btSolverBody *local_240;
  btSolverBody *local_238;
  int local_230;
  int local_22c;
  btRigidBody *local_228;
  btRigidBody *local_220;
  btTypedConstraint *local_218;
  btSolverConstraint *local_210;
  btConstraintInfo1 *local_208;
  int local_1fc;
  btJointFeedback *local_1f8;
  btConstraintInfo1 *local_1f0;
  int local_1e8;
  int local_1e4;
  btTypedConstraint *local_1e0;
  int local_1d8;
  btScalar local_1d4;
  btScalar bStack_1d0;
  btScalar abStack_1cc [2];
  btScalar local_1c4;
  btScalar bStack_1c0;
  btScalar abStack_1bc [2];
  btScalar local_1b4;
  btScalar bStack_1b0;
  undefined8 local_1ac;
  btVector3 local_1a4;
  btScalar local_194;
  btScalar bStack_190;
  btScalar abStack_18c [2];
  btScalar local_184;
  btScalar local_180;
  btScalar local_17c;
  btVector3 local_178;
  btSolverBody *local_160;
  btRigidBody *local_158;
  int local_150;
  int local_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  int local_38;
  long local_30;
  undefined4 local_24;
  undefined8 local_20;
  int local_14;
  long local_10;
  
  uVar3 = _local_798;
  *(undefined4 *)((long)in_RDI + 300) = 0xffffffff;
  local_30 = in_R9;
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  CProfileSample::CProfileSample
            ((CProfileSample *)in_stack_fffffffffffff6a0,
             (char *)CONCAT44(in_stack_fffffffffffff69c,in_stack_fffffffffffff698));
  *(undefined4 *)(in_RDI + 0x25) = 0;
  for (local_38 = 0; iVar6 = (int)((ulong)in_stack_fffffffffffff6d8 >> 0x20), local_38 < local_14;
      local_38 = local_38 + 1) {
    btCollisionObject::setCompanionId(*(btCollisionObject **)(local_10 + (long)local_38 * 8),-1);
  }
  btAlignedObjectArray<btSolverBody>::reserve(in_stack_fffffffffffff6b0,in_stack_fffffffffffff6ac);
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_58 = 0;
  btSolverBody::btSolverBody(in_stack_fffffffffffff6a0);
  btAlignedObjectArray<btSolverBody>::resize
            ((btAlignedObjectArray<btSolverBody> *)
             CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),iVar6,
             (btSolverBody *)CONCAT44(in_stack_fffffffffffff6d4,in_stack_fffffffffffff6d0));
  for (local_14c = 0; local_14c < local_14; local_14c = local_14c + 1) {
    local_150 = getOrInitSolverBody(in_stack_fffffffffffff8c8,in_stack_fffffffffffff8b8._8_8_,
                                    in_stack_fffffffffffff8b8._4_4_);
    local_158 = btRigidBody::upcast((btCollisionObject *)
                                    CONCAT44(in_stack_fffffffffffff69c,in_stack_fffffffffffff698));
    if (local_158 != (btRigidBody *)0x0) {
      bVar13 = btRigidBody::getInvMass(local_158);
      if ((bVar13 != 0.0) || (NAN(bVar13))) {
        local_160 = btAlignedObjectArray<btSolverBody>::operator[]
                              ((btAlignedObjectArray<btSolverBody> *)(in_RDI + 1),local_150);
        local_17c = 0.0;
        local_180 = 0.0;
        local_184 = 0.0;
        btVector3::btVector3(&local_178,&local_17c,&local_180,&local_184);
        uVar5 = btRigidBody::getFlags(local_158);
        if ((uVar5 & 2) != 0) {
          bVar15 = btRigidBody::computeGyroscopicForceExplicit
                             (in_stack_fffffffffffff768._8_8_,in_stack_fffffffffffff768._4_4_);
          abStack_18c = bVar15.m_floats._8_8_;
          local_4e8 = bVar15.m_floats[0];
          bStack_4e4 = bVar15.m_floats[1];
          local_194 = local_4e8;
          bStack_190 = bStack_4e4;
          local_178.m_floats._0_8_ = bVar15.m_floats._0_8_;
          local_178.m_floats._8_8_ = abStack_18c;
          btRigidBody::getInvInertiaTensorWorld(local_158);
          bVar15 = ::operator*((btVector3 *)in_stack_fffffffffffff6b0,
                               (btMatrix3x3 *)
                               CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
          local_1ac = bVar15.m_floats._8_8_;
          local_518 = bVar15.m_floats[0];
          bStack_514 = bVar15.m_floats[1];
          local_1b4 = local_518;
          bStack_1b0 = bStack_514;
          bVar15 = ::operator*((btVector3 *)in_stack_fffffffffffff6b0,
                               (btScalar *)
                               CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
          local_1a4.m_floats._8_8_ = bVar15.m_floats._8_8_;
          local_538 = bVar15.m_floats[0];
          bStack_534 = bVar15.m_floats[1];
          local_1a4.m_floats[0] = local_538;
          local_1a4.m_floats[1] = bStack_534;
          btVector3::operator-=(&local_160->m_externalTorqueImpulse,&local_1a4);
        }
        uVar5 = btRigidBody::getFlags(local_158);
        if ((uVar5 & 4) != 0) {
          bVar13 = (btScalar)((ulong)uVar3 >> 0x20);
          bVar15 = btRigidBody::computeGyroscopicImpulseImplicit_World
                             (in_stack_fffffffffffff870,bVar13);
          abStack_1bc = bVar15.m_floats._8_8_;
          local_568 = bVar15.m_floats[0];
          bStack_564 = bVar15.m_floats[1];
          local_1c4 = local_568;
          bStack_1c0 = bStack_564;
          local_178.m_floats._0_8_ = bVar15.m_floats._0_8_;
          local_178.m_floats._8_8_ = abStack_1bc;
          btVector3::operator+=(&local_160->m_externalTorqueImpulse,&local_178);
        }
        uVar5 = btRigidBody::getFlags(local_158);
        if ((uVar5 & 8) != 0) {
          bVar15 = btRigidBody::computeGyroscopicImpulseImplicit_Body
                             ((btRigidBody *)
                              CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                              in_stack_fffffffffffff98c);
          abStack_1cc = bVar15.m_floats._8_8_;
          local_598 = bVar15.m_floats[0];
          bStack_594 = bVar15.m_floats[1];
          local_1d4 = local_598;
          bStack_1d0 = bStack_594;
          local_178.m_floats._0_8_ = bVar15.m_floats._0_8_;
          local_178.m_floats._8_8_ = abStack_1cc;
          btVector3::operator+=(&local_160->m_externalTorqueImpulse,&local_178);
        }
      }
    }
  }
  for (local_1d8 = 0; local_1d8 < in_stack_00000008; local_1d8 = local_1d8 + 1) {
    local_1e0 = *(btTypedConstraint **)(local_30 + (long)local_1d8 * 8);
    (*local_1e0->_vptr_btTypedConstraint[2])();
    btTypedConstraint::internalSetAppliedImpulse(local_1e0,0.0);
  }
  local_1e4 = 0;
  btAlignedObjectArray<btTypedConstraint::btConstraintInfo1>::resizeNoInitialize
            ((btAlignedObjectArray<btTypedConstraint::btConstraintInfo1> *)in_stack_fffffffffffff6a0
             ,in_stack_fffffffffffff69c);
  for (local_1e8 = 0; local_1e8 < in_stack_00000008; local_1e8 = local_1e8 + 1) {
    local_1f0 = btAlignedObjectArray<btTypedConstraint::btConstraintInfo1>::operator[]
                          ((btAlignedObjectArray<btTypedConstraint::btConstraintInfo1> *)
                           (in_RDI + 0x21),local_1e8);
    local_1f8 = btTypedConstraint::getJointFeedback
                          (*(btTypedConstraint **)(local_30 + (long)local_1e8 * 8));
    if (local_1f8 != (btJointFeedback *)0x0) {
      btVector3::setZero((btVector3 *)in_stack_fffffffffffff6a0);
      btVector3::setZero((btVector3 *)in_stack_fffffffffffff6a0);
      btVector3::setZero((btVector3 *)in_stack_fffffffffffff6a0);
      btVector3::setZero((btVector3 *)in_stack_fffffffffffff6a0);
    }
    btTypedConstraint::isEnabled(*(btTypedConstraint **)(local_30 + (long)local_1e8 * 8));
    bVar4 = btTypedConstraint::isEnabled(*(btTypedConstraint **)(local_30 + (long)local_1e8 * 8));
    if (bVar4) {
      plVar2 = *(long **)(local_30 + (long)local_1e8 * 8);
      (**(code **)(*plVar2 + 0x20))(plVar2,local_1f0);
    }
    else {
      local_1f0->m_numConstraintRows = 0;
      local_1f0->nub = 0;
    }
    local_1e4 = local_1f0->m_numConstraintRows + local_1e4;
  }
  btAlignedObjectArray<btSolverConstraint>::resizeNoInitialize
            ((btAlignedObjectArray<btSolverConstraint> *)in_stack_fffffffffffff6a0,
             in_stack_fffffffffffff69c);
  local_1fc = 0;
  for (local_1e8 = 0; local_1e8 < in_stack_00000008; local_1e8 = local_1e8 + 1) {
    local_208 = btAlignedObjectArray<btTypedConstraint::btConstraintInfo1>::operator[]
                          ((btAlignedObjectArray<btTypedConstraint::btConstraintInfo1> *)
                           (in_RDI + 0x21),local_1e8);
    if (local_208->m_numConstraintRows != 0) {
      local_210 = btAlignedObjectArray<btSolverConstraint>::operator[]
                            ((btAlignedObjectArray<btSolverConstraint> *)(in_RDI + 9),local_1fc);
      local_218 = *(btTypedConstraint **)(local_30 + (long)local_1e8 * 8);
      local_220 = btTypedConstraint::getRigidBodyA(local_218);
      local_228 = btTypedConstraint::getRigidBodyB(local_218);
      local_22c = getOrInitSolverBody(in_stack_fffffffffffff8c8,in_stack_fffffffffffff8b8._8_8_,
                                      in_stack_fffffffffffff8b8._4_4_);
      local_230 = getOrInitSolverBody(in_stack_fffffffffffff8c8,in_stack_fffffffffffff8b8._8_8_,
                                      in_stack_fffffffffffff8b8._4_4_);
      local_238 = btAlignedObjectArray<btSolverBody>::operator[]
                            ((btAlignedObjectArray<btSolverBody> *)(in_RDI + 1),local_22c);
      local_240 = btAlignedObjectArray<btSolverBody>::operator[]
                            ((btAlignedObjectArray<btSolverBody> *)(in_RDI + 1),local_230);
      iVar6 = btTypedConstraint::getOverrideNumSolverIterations(local_218);
      if (iVar6 < 1) {
        local_604 = *(int *)(in_stack_00000010 + 0x14);
      }
      else {
        local_604 = btTypedConstraint::getOverrideNumSolverIterations(local_218);
      }
      local_244 = local_604;
      if ((int)in_RDI[0x25] < local_604) {
        *(int *)(in_RDI + 0x25) = local_604;
      }
      for (local_248 = 0; local_248 < local_208->m_numConstraintRows; local_248 = local_248 + 1) {
        memset(local_210 + local_248,0,0xa0);
        local_210[local_248].m_lowerLimit = -3.4028235e+38;
        local_210[local_248].m_upperLimit = 3.4028235e+38;
        local_210[local_248].m_appliedImpulse = 0.0;
        local_210[local_248].m_appliedPushImpulse = 0.0;
        local_210[local_248].m_solverBodyIdA = local_22c;
        local_210[local_248].m_solverBodyIdB = local_230;
        local_210[local_248].m_overrideNumSolverIterations = local_244;
      }
      pbVar9 = btSolverBody::internalGetDeltaLinearVelocity(local_238);
      local_24c = 0.0;
      local_250 = 0.0;
      local_254 = 0.0;
      btVector3::setValue(pbVar9,&local_24c,&local_250,&local_254);
      pbVar9 = btSolverBody::internalGetDeltaAngularVelocity(local_238);
      local_258 = 0.0;
      local_25c = 0.0;
      local_260 = 0.0;
      btVector3::setValue(pbVar9,&local_258,&local_25c,&local_260);
      pbVar9 = btSolverBody::internalGetPushVelocity(local_238);
      local_264 = 0.0;
      local_268 = 0.0;
      local_26c = 0.0;
      btVector3::setValue(pbVar9,&local_264,&local_268,&local_26c);
      pbVar9 = btSolverBody::internalGetTurnVelocity(local_238);
      local_270 = 0.0;
      local_274 = 0.0;
      local_278 = 0.0;
      btVector3::setValue(pbVar9,&local_270,&local_274,&local_278);
      pbVar9 = btSolverBody::internalGetDeltaLinearVelocity(local_240);
      local_27c = 0.0;
      local_280 = 0.0;
      local_284 = 0.0;
      btVector3::setValue(pbVar9,&local_27c,&local_280,&local_284);
      pbVar9 = btSolverBody::internalGetDeltaAngularVelocity(local_240);
      local_288 = 0.0;
      local_28c = 0.0;
      local_290 = 0.0;
      btVector3::setValue(pbVar9,&local_288,&local_28c,&local_290);
      pbVar9 = btSolverBody::internalGetPushVelocity(local_240);
      local_294 = 0.0;
      local_298 = 0.0;
      local_29c = 0.0;
      btVector3::setValue(pbVar9,&local_294,&local_298,&local_29c);
      pbVar9 = btSolverBody::internalGetTurnVelocity(local_240);
      local_2a0 = 0.0;
      local_2a4 = 0.0;
      local_2a8 = 0.0;
      btVector3::setValue(pbVar9,&local_2a0,&local_2a4,&local_2a8);
      local_308 = 1.0 / *(float *)(in_stack_00000010 + 0xc);
      local_304 = *(undefined4 *)(in_stack_00000010 + 0x20);
      local_300 = btVector3::operator_cast_to_float_(&local_210->m_contactNormal1);
      local_2f8 = btVector3::operator_cast_to_float_(&local_210->m_relpos1CrossNormal);
      local_2f0 = btVector3::operator_cast_to_float_(&local_210->m_contactNormal2);
      local_2e8 = btVector3::operator_cast_to_float_(&local_210->m_relpos2CrossNormal);
      local_2e0 = 0x28;
      local_2d8 = &local_210->m_rhs;
      local_210->m_cfm = *(btScalar *)(in_stack_00000010 + 0x28);
      local_2ac = *(float *)(in_stack_00000010 + 4);
      local_2d0 = &local_210->m_cfm;
      local_2c8 = &local_210->m_lowerLimit;
      local_2c0 = &local_210->m_upperLimit;
      local_2b0 = *(undefined4 *)(in_stack_00000010 + 0x14);
      plVar2 = *(long **)(local_30 + (long)local_1e8 * 8);
      (**(code **)(*plVar2 + 0x28))(plVar2,&local_308);
      for (local_248 = 0; local_248 < local_208->m_numConstraintRows; local_248 = local_248 + 1) {
        local_310 = local_210 + local_248;
        bVar13 = local_310->m_upperLimit;
        bVar14 = btTypedConstraint::getBreakingImpulseThreshold
                           (*(btTypedConstraint **)(local_30 + (long)local_1e8 * 8));
        if (bVar14 <= bVar13) {
          bVar13 = btTypedConstraint::getBreakingImpulseThreshold
                             (*(btTypedConstraint **)(local_30 + (long)local_1e8 * 8));
          local_310->m_upperLimit = bVar13;
        }
        fVar1 = local_310->m_lowerLimit;
        bVar13 = btTypedConstraint::getBreakingImpulseThreshold
                           (*(btTypedConstraint **)(local_30 + (long)local_1e8 * 8));
        if (fVar1 <= -bVar13) {
          bVar13 = btTypedConstraint::getBreakingImpulseThreshold
                             (*(btTypedConstraint **)(local_30 + (long)local_1e8 * 8));
          local_310->m_lowerLimit = -bVar13;
        }
        (local_310->field_15).m_originalContactPoint = local_218;
        local_318 = local_310;
        pbVar10 = btTypedConstraint::getRigidBodyA(local_218);
        btRigidBody::getInvInertiaTensorWorld(pbVar10);
        bVar15 = ::operator*((btMatrix3x3 *)in_stack_fffffffffffff6b0,
                             (btVector3 *)
                             CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
        local_330 = bVar15.m_floats._8_8_;
        local_6a8 = bVar15.m_floats[0];
        bStack_6a4 = bVar15.m_floats[1];
        local_338 = local_6a8;
        bStack_334 = bStack_6a4;
        pbVar10 = btTypedConstraint::getRigidBodyA(local_218);
        btRigidBody::getAngularFactor(pbVar10);
        bVar15 = ::operator*((btVector3 *)in_stack_fffffffffffff6b0,
                             (btVector3 *)
                             CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
        uStack_320 = bVar15.m_floats._8_8_;
        local_6d8 = bVar15.m_floats[0];
        bStack_6d4 = bVar15.m_floats[1];
        local_328 = local_6d8;
        bStack_324 = bStack_6d4;
        *(long *)(local_310->m_angularComponentA).m_floats = bVar15.m_floats._0_8_;
        *(undefined8 *)((local_310->m_angularComponentA).m_floats + 2) = uStack_320;
        local_340 = &local_310->m_relpos2CrossNormal;
        pbVar10 = btTypedConstraint::getRigidBodyB(local_218);
        btRigidBody::getInvInertiaTensorWorld(pbVar10);
        bVar15 = ::operator*((btMatrix3x3 *)in_stack_fffffffffffff6b0,
                             (btVector3 *)
                             CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
        local_358 = bVar15.m_floats._8_8_;
        local_708 = bVar15.m_floats[0];
        bStack_704 = bVar15.m_floats[1];
        uStack_700 = (undefined4)extraout_XMM0_Qb;
        uStack_6fc = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
        local_360 = local_708;
        bStack_35c = bStack_704;
        pbVar10 = btTypedConstraint::getRigidBodyB(local_218);
        btRigidBody::getAngularFactor(pbVar10);
        bVar15 = ::operator*((btVector3 *)in_stack_fffffffffffff6b0,
                             (btVector3 *)
                             CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
        in_stack_fffffffffffff8c8 = bVar15.m_floats._0_8_;
        uStack_348 = bVar15.m_floats._8_8_;
        in_stack_fffffffffffff8b8._8_4_ = uStack_700;
        in_stack_fffffffffffff8b8._0_8_ = uStack_348;
        in_stack_fffffffffffff8b8._12_4_ = uStack_6fc;
        local_350 = bVar15.m_floats[0];
        bStack_34c = bVar15.m_floats[1];
        *(btSequentialImpulseConstraintSolver **)(local_310->m_angularComponentB).m_floats =
             in_stack_fffffffffffff8c8;
        *(undefined8 *)((local_310->m_angularComponentB).m_floats + 2) = uStack_348;
        local_374 = btRigidBody::getInvMass(local_220);
        bVar15 = ::operator*((btVector3 *)in_stack_fffffffffffff6b0,
                             (btScalar *)
                             CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
        local_370.m_floats._8_8_ = bVar15.m_floats._8_8_;
        local_768 = bVar15.m_floats[0];
        bStack_764 = bVar15.m_floats[1];
        local_370.m_floats[0] = local_768;
        local_370.m_floats[1] = bStack_764;
        btRigidBody::getInvInertiaTensorWorld(local_220);
        bVar15 = ::operator*((btMatrix3x3 *)in_stack_fffffffffffff6b0,
                             (btVector3 *)
                             CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
        local_384.m_floats._8_8_ = bVar15.m_floats._8_8_;
        local_798 = bVar15.m_floats[0];
        bVar13 = bVar15.m_floats[1];
        local_384.m_floats[0] = local_798;
        local_384.m_floats[1] = bVar13;
        local_398 = btRigidBody::getInvMass(local_228);
        bVar15 = ::operator*((btVector3 *)in_stack_fffffffffffff6b0,
                             (btScalar *)
                             CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
        local_394.m_floats._8_8_ = bVar15.m_floats._8_8_;
        local_7c8 = bVar15.m_floats[0];
        bStack_7c4 = bVar15.m_floats[1];
        local_394.m_floats[0] = local_7c8;
        local_394.m_floats[1] = bStack_7c4;
        btRigidBody::getInvInertiaTensorWorld(local_228);
        bVar15 = ::operator*((btMatrix3x3 *)in_stack_fffffffffffff6b0,
                             (btVector3 *)
                             CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
        local_3a8.m_floats._0_8_ = bVar15.m_floats._0_8_;
        local_3a8.m_floats._8_8_ = bVar15.m_floats._8_8_;
        local_3ac = btVector3::dot(&local_370,&local_310->m_contactNormal1);
        bVar13 = btVector3::dot(&local_384,&local_310->m_relpos1CrossNormal);
        local_3ac = local_3ac + bVar13;
        bVar13 = btVector3::dot(&local_394,&local_310->m_contactNormal2);
        local_3ac = local_3ac + bVar13;
        bVar13 = btVector3::dot(&local_3a8,&local_310->m_relpos2CrossNormal);
        local_3ac = local_3ac + bVar13;
        local_3b0 = btFabs(local_3ac);
        if (local_3b0 <= 1.1920929e-07) {
          local_820 = 0.0;
        }
        else {
          local_820 = 1.0 / local_3ac;
        }
        local_310->m_jacDiagABInv = local_820;
        if (local_238->m_originalBody == (btRigidBody *)0x0) {
          local_3c8 = 0.0;
          local_3cc = 0.0;
          local_3d0 = 0.0;
          btVector3::btVector3(&local_3c4,&local_3c8,&local_3cc,&local_3d0);
        }
        else {
          local_3c4.m_floats._0_8_ = *(undefined8 *)(local_238->m_externalForceImpulse).m_floats;
          local_3c4.m_floats._8_8_ =
               *(undefined8 *)((local_238->m_externalForceImpulse).m_floats + 2);
        }
        if (local_238->m_originalBody == (btRigidBody *)0x0) {
          local_3e4 = 0.0;
          local_3e8 = 0.0;
          local_3ec = 0.0;
          btVector3::btVector3(&local_3e0,&local_3e4,&local_3e8,&local_3ec);
        }
        else {
          local_3e0.m_floats._0_8_ = *(undefined8 *)(local_238->m_externalTorqueImpulse).m_floats;
          local_3e0.m_floats._8_8_ =
               *(undefined8 *)((local_238->m_externalTorqueImpulse).m_floats + 2);
        }
        if (local_240->m_originalBody == (btRigidBody *)0x0) {
          local_400 = 0.0;
          local_404 = 0.0;
          local_408 = 0.0;
          btVector3::btVector3(&local_3fc,&local_400,&local_404,&local_408);
        }
        else {
          local_3fc.m_floats._0_8_ = *(undefined8 *)(local_240->m_externalForceImpulse).m_floats;
          local_3fc.m_floats._8_8_ =
               *(undefined8 *)((local_240->m_externalForceImpulse).m_floats + 2);
        }
        if (local_240->m_originalBody == (btRigidBody *)0x0) {
          local_41c = 0.0;
          local_420 = 0.0;
          local_424 = 0.0;
          btVector3::btVector3(&local_418,&local_41c,&local_420,&local_424);
        }
        else {
          local_418.m_floats._0_8_ = *(undefined8 *)(local_240->m_externalTorqueImpulse).m_floats;
          local_418.m_floats._8_8_ =
               *(undefined8 *)((local_240->m_externalTorqueImpulse).m_floats + 2);
        }
        pbVar9 = &local_310->m_contactNormal1;
        btRigidBody::getLinearVelocity(local_220);
        bVar15 = operator+((btVector3 *)in_stack_fffffffffffff6b0,
                           (btVector3 *)
                           CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
        local_438.m_floats._8_8_ = bVar15.m_floats._8_8_;
        local_848 = bVar15.m_floats[0];
        bStack_844 = bVar15.m_floats[1];
        local_438.m_floats[0] = local_848;
        local_438.m_floats[1] = bStack_844;
        bVar13 = btVector3::dot(pbVar9,&local_438);
        this_00 = local_310;
        btRigidBody::getAngularVelocity(local_220);
        bVar15 = operator+((btVector3 *)in_stack_fffffffffffff6b0,
                           (btVector3 *)
                           CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
        local_448.m_floats._0_8_ = bVar15.m_floats._0_8_;
        local_448.m_floats._8_8_ = bVar15.m_floats._8_8_;
        bVar14 = btVector3::dot(&this_00->m_relpos1CrossNormal,&local_448);
        local_428 = bVar13 + bVar14;
        pbVar9 = &local_310->m_contactNormal2;
        btRigidBody::getLinearVelocity(local_228);
        bVar15 = operator+((btVector3 *)in_stack_fffffffffffff6b0,
                           (btVector3 *)
                           CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
        local_45c.m_floats._8_8_ = bVar15.m_floats._8_8_;
        local_8c8 = bVar15.m_floats[0];
        bStack_8c4 = bVar15.m_floats[1];
        local_45c.m_floats[0] = local_8c8;
        local_45c.m_floats[1] = bStack_8c4;
        bVar13 = btVector3::dot(pbVar9,&local_45c);
        pbVar9 = &local_310->m_relpos2CrossNormal;
        btRigidBody::getAngularVelocity(local_228);
        bVar15 = operator+((btVector3 *)in_stack_fffffffffffff6b0,
                           (btVector3 *)
                           CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
        local_46c.m_floats._0_8_ = bVar15.m_floats._0_8_;
        local_46c.m_floats._8_8_ = bVar15.m_floats._8_8_;
        bVar14 = btVector3::dot(pbVar9,&local_46c);
        local_44c = bVar13 + bVar14;
        local_3b4 = local_428 + local_44c;
        local_310->m_rhs =
             local_310->m_rhs * local_310->m_jacDiagABInv +
             (-local_3b4 * local_2ac + 0.0) * local_310->m_jacDiagABInv;
        local_310->m_appliedImpulse = 0.0;
      }
    }
    pbVar11 = btAlignedObjectArray<btTypedConstraint::btConstraintInfo1>::operator[]
                        ((btAlignedObjectArray<btTypedConstraint::btConstraintInfo1> *)
                         (in_RDI + 0x21),local_1e8);
    local_1fc = pbVar11->m_numConstraintRows + local_1fc;
  }
  (**(code **)(*in_RDI + 0x38))(in_RDI,local_20,local_24,in_stack_00000010);
  iVar6 = btAlignedObjectArray<btSolverConstraint>::size
                    ((btAlignedObjectArray<btSolverConstraint> *)(in_RDI + 9));
  iVar7 = btAlignedObjectArray<btSolverConstraint>::size
                    ((btAlignedObjectArray<btSolverConstraint> *)(in_RDI + 5));
  iVar8 = btAlignedObjectArray<btSolverConstraint>::size
                    ((btAlignedObjectArray<btSolverConstraint> *)(in_RDI + 0xd));
  btAlignedObjectArray<int>::resizeNoInitialize
            ((btAlignedObjectArray<int> *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff69c);
  if ((*(uint *)(in_stack_00000010 + 0x40) & 0x10) == 0) {
    btAlignedObjectArray<int>::resizeNoInitialize
              ((btAlignedObjectArray<int> *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff69c);
  }
  else {
    btAlignedObjectArray<int>::resizeNoInitialize
              ((btAlignedObjectArray<int> *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff69c);
  }
  btAlignedObjectArray<int>::resizeNoInitialize
            ((btAlignedObjectArray<int> *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff69c);
  for (local_490 = 0; local_490 < iVar6; local_490 = local_490 + 1) {
    piVar12 = btAlignedObjectArray<int>::operator[]
                        ((btAlignedObjectArray<int> *)(in_RDI + 0x19),local_490);
    *piVar12 = local_490;
  }
  for (local_490 = 0; local_490 < iVar7; local_490 = local_490 + 1) {
    iVar6 = local_490;
    piVar12 = btAlignedObjectArray<int>::operator[]
                        ((btAlignedObjectArray<int> *)(in_RDI + 0x15),local_490);
    *piVar12 = iVar6;
  }
  for (local_490 = 0; local_490 < iVar8; local_490 = local_490 + 1) {
    iVar6 = local_490;
    piVar12 = btAlignedObjectArray<int>::operator[]
                        ((btAlignedObjectArray<int> *)(in_RDI + 0x1d),local_490);
    *piVar12 = iVar6;
  }
  CProfileSample::~CProfileSample((CProfileSample *)0x21977b);
  return 0.0;
}

Assistant:

btScalar btSequentialImpulseConstraintSolver::solveGroupCacheFriendlySetup(btCollisionObject** bodies, int numBodies, btPersistentManifold** manifoldPtr, int numManifolds,btTypedConstraint** constraints,int numConstraints,const btContactSolverInfo& infoGlobal,btIDebugDraw* debugDrawer)
{
	m_fixedBodyId = -1;
	BT_PROFILE("solveGroupCacheFriendlySetup");
	(void)debugDrawer;

	m_maxOverrideNumSolverIterations = 0;

#ifdef BT_ADDITIONAL_DEBUG
	 //make sure that dynamic bodies exist for all (enabled) constraints
	for (int i=0;i<numConstraints;i++)
	{
		btTypedConstraint* constraint = constraints[i];
		if (constraint->isEnabled())
		{
			if (!constraint->getRigidBodyA().isStaticOrKinematicObject())
			{
				bool found=false;
				for (int b=0;b<numBodies;b++)
				{

					if (&constraint->getRigidBodyA()==bodies[b])
					{
						found = true;
						break;
					}
				}
				btAssert(found);
			}
			if (!constraint->getRigidBodyB().isStaticOrKinematicObject())
			{
				bool found=false;
				for (int b=0;b<numBodies;b++)
				{
					if (&constraint->getRigidBodyB()==bodies[b])
					{
						found = true;
						break;
					}
				}
				btAssert(found);
			}
		}
	}
    //make sure that dynamic bodies exist for all contact manifolds
    for (int i=0;i<numManifolds;i++)
    {
        if (!manifoldPtr[i]->getBody0()->isStaticOrKinematicObject())
        {
            bool found=false;
            for (int b=0;b<numBodies;b++)
            {

                if (manifoldPtr[i]->getBody0()==bodies[b])
                {
                    found = true;
                    break;
                }
            }
            btAssert(found);
        }
        if (!manifoldPtr[i]->getBody1()->isStaticOrKinematicObject())
        {
            bool found=false;
            for (int b=0;b<numBodies;b++)
            {
                if (manifoldPtr[i]->getBody1()==bodies[b])
                {
                    found = true;
                    break;
                }
            }
            btAssert(found);
        }
    }
#endif //BT_ADDITIONAL_DEBUG


	for (int i = 0; i < numBodies; i++)
	{
		bodies[i]->setCompanionId(-1);
	}


	m_tmpSolverBodyPool.reserve(numBodies+1);
	m_tmpSolverBodyPool.resize(0);

	//btSolverBody& fixedBody = m_tmpSolverBodyPool.expand();
    //initSolverBody(&fixedBody,0);

	//convert all bodies


	for (int i=0;i<numBodies;i++)
	{
		int bodyId = getOrInitSolverBody(*bodies[i],infoGlobal.m_timeStep);

		btRigidBody* body = btRigidBody::upcast(bodies[i]);
		if (body && body->getInvMass())
		{
			btSolverBody& solverBody = m_tmpSolverBodyPool[bodyId];
			btVector3 gyroForce (0,0,0);
			if (body->getFlags()&BT_ENABLE_GYROSCOPIC_FORCE_EXPLICIT)
			{
				gyroForce = body->computeGyroscopicForceExplicit(infoGlobal.m_maxGyroscopicForce);
				solverBody.m_externalTorqueImpulse -= gyroForce*body->getInvInertiaTensorWorld()*infoGlobal.m_timeStep;
			}
			if (body->getFlags()&BT_ENABLE_GYROSCOPIC_FORCE_IMPLICIT_WORLD)
			{
				gyroForce = body->computeGyroscopicImpulseImplicit_World(infoGlobal.m_timeStep);
				solverBody.m_externalTorqueImpulse += gyroForce;
			}
			if (body->getFlags()&BT_ENABLE_GYROSCOPIC_FORCE_IMPLICIT_BODY)
			{
				gyroForce = body->computeGyroscopicImpulseImplicit_Body(infoGlobal.m_timeStep);
				solverBody.m_externalTorqueImpulse += gyroForce;

			}
			

		}
	}

	if (1)
	{
		int j;
		for (j=0;j<numConstraints;j++)
		{
			btTypedConstraint* constraint = constraints[j];
			constraint->buildJacobian();
			constraint->internalSetAppliedImpulse(0.0f);
		}
	}

	//btRigidBody* rb0=0,*rb1=0;

	//if (1)
	{
		{

			int totalNumRows = 0;
			int i;

			m_tmpConstraintSizesPool.resizeNoInitialize(numConstraints);
			//calculate the total number of contraint rows
			for (i=0;i<numConstraints;i++)
			{
				btTypedConstraint::btConstraintInfo1& info1 = m_tmpConstraintSizesPool[i];
				btJointFeedback* fb = constraints[i]->getJointFeedback();
				if (fb)
				{
					fb->m_appliedForceBodyA.setZero();
					fb->m_appliedTorqueBodyA.setZero();
					fb->m_appliedForceBodyB.setZero();
					fb->m_appliedTorqueBodyB.setZero();
				}

				if (constraints[i]->isEnabled())
				{
				}
				if (constraints[i]->isEnabled())
				{
					constraints[i]->getInfo1(&info1);
				} else
				{
					info1.m_numConstraintRows = 0;
					info1.nub = 0;
				}
				totalNumRows += info1.m_numConstraintRows;
			}
			m_tmpSolverNonContactConstraintPool.resizeNoInitialize(totalNumRows);


			///setup the btSolverConstraints
			int currentRow = 0;

			for (i=0;i<numConstraints;i++)
			{
				const btTypedConstraint::btConstraintInfo1& info1 = m_tmpConstraintSizesPool[i];

				if (info1.m_numConstraintRows)
				{
					btAssert(currentRow<totalNumRows);

					btSolverConstraint* currentConstraintRow = &m_tmpSolverNonContactConstraintPool[currentRow];
					btTypedConstraint* constraint = constraints[i];
					btRigidBody& rbA = constraint->getRigidBodyA();
					btRigidBody& rbB = constraint->getRigidBodyB();

					int solverBodyIdA = getOrInitSolverBody(rbA,infoGlobal.m_timeStep);
                    int solverBodyIdB = getOrInitSolverBody(rbB,infoGlobal.m_timeStep);

                    btSolverBody* bodyAPtr = &m_tmpSolverBodyPool[solverBodyIdA];
                    btSolverBody* bodyBPtr = &m_tmpSolverBodyPool[solverBodyIdB];




					int overrideNumSolverIterations = constraint->getOverrideNumSolverIterations() > 0 ? constraint->getOverrideNumSolverIterations() : infoGlobal.m_numIterations;
					if (overrideNumSolverIterations>m_maxOverrideNumSolverIterations)
						m_maxOverrideNumSolverIterations = overrideNumSolverIterations;


					int j;
					for ( j=0;j<info1.m_numConstraintRows;j++)
					{
						memset(&currentConstraintRow[j],0,sizeof(btSolverConstraint));
						currentConstraintRow[j].m_lowerLimit = -SIMD_INFINITY;
						currentConstraintRow[j].m_upperLimit = SIMD_INFINITY;
						currentConstraintRow[j].m_appliedImpulse = 0.f;
						currentConstraintRow[j].m_appliedPushImpulse = 0.f;
						currentConstraintRow[j].m_solverBodyIdA = solverBodyIdA;
						currentConstraintRow[j].m_solverBodyIdB = solverBodyIdB;
						currentConstraintRow[j].m_overrideNumSolverIterations = overrideNumSolverIterations;
					}

					bodyAPtr->internalGetDeltaLinearVelocity().setValue(0.f,0.f,0.f);
					bodyAPtr->internalGetDeltaAngularVelocity().setValue(0.f,0.f,0.f);
					bodyAPtr->internalGetPushVelocity().setValue(0.f,0.f,0.f);
					bodyAPtr->internalGetTurnVelocity().setValue(0.f,0.f,0.f);
					bodyBPtr->internalGetDeltaLinearVelocity().setValue(0.f,0.f,0.f);
					bodyBPtr->internalGetDeltaAngularVelocity().setValue(0.f,0.f,0.f);
					bodyBPtr->internalGetPushVelocity().setValue(0.f,0.f,0.f);
					bodyBPtr->internalGetTurnVelocity().setValue(0.f,0.f,0.f);


					btTypedConstraint::btConstraintInfo2 info2;
					info2.fps = 1.f/infoGlobal.m_timeStep;
					info2.erp = infoGlobal.m_erp;
					info2.m_J1linearAxis = currentConstraintRow->m_contactNormal1;
					info2.m_J1angularAxis = currentConstraintRow->m_relpos1CrossNormal;
					info2.m_J2linearAxis = currentConstraintRow->m_contactNormal2;
					info2.m_J2angularAxis = currentConstraintRow->m_relpos2CrossNormal;
					info2.rowskip = sizeof(btSolverConstraint)/sizeof(btScalar);//check this
					///the size of btSolverConstraint needs be a multiple of btScalar
		            btAssert(info2.rowskip*sizeof(btScalar)== sizeof(btSolverConstraint));
					info2.m_constraintError = &currentConstraintRow->m_rhs;
					currentConstraintRow->m_cfm = infoGlobal.m_globalCfm;
					info2.m_damping = infoGlobal.m_damping;
					info2.cfm = &currentConstraintRow->m_cfm;
					info2.m_lowerLimit = &currentConstraintRow->m_lowerLimit;
					info2.m_upperLimit = &currentConstraintRow->m_upperLimit;
					info2.m_numIterations = infoGlobal.m_numIterations;
					constraints[i]->getInfo2(&info2);

					///finalize the constraint setup
					for ( j=0;j<info1.m_numConstraintRows;j++)
					{
						btSolverConstraint& solverConstraint = currentConstraintRow[j];

						if (solverConstraint.m_upperLimit>=constraints[i]->getBreakingImpulseThreshold())
						{
							solverConstraint.m_upperLimit = constraints[i]->getBreakingImpulseThreshold();
						}

						if (solverConstraint.m_lowerLimit<=-constraints[i]->getBreakingImpulseThreshold())
						{
							solverConstraint.m_lowerLimit = -constraints[i]->getBreakingImpulseThreshold();
						}

						solverConstraint.m_originalContactPoint = constraint;

						{
							const btVector3& ftorqueAxis1 = solverConstraint.m_relpos1CrossNormal;
							solverConstraint.m_angularComponentA = constraint->getRigidBodyA().getInvInertiaTensorWorld()*ftorqueAxis1*constraint->getRigidBodyA().getAngularFactor();
						}
						{
							const btVector3& ftorqueAxis2 = solverConstraint.m_relpos2CrossNormal;
							solverConstraint.m_angularComponentB = constraint->getRigidBodyB().getInvInertiaTensorWorld()*ftorqueAxis2*constraint->getRigidBodyB().getAngularFactor();
						}

						{
							btVector3 iMJlA = solverConstraint.m_contactNormal1*rbA.getInvMass();
							btVector3 iMJaA = rbA.getInvInertiaTensorWorld()*solverConstraint.m_relpos1CrossNormal;
							btVector3 iMJlB = solverConstraint.m_contactNormal2*rbB.getInvMass();//sign of normal?
							btVector3 iMJaB = rbB.getInvInertiaTensorWorld()*solverConstraint.m_relpos2CrossNormal;

							btScalar sum = iMJlA.dot(solverConstraint.m_contactNormal1);
							sum += iMJaA.dot(solverConstraint.m_relpos1CrossNormal);
							sum += iMJlB.dot(solverConstraint.m_contactNormal2);
							sum += iMJaB.dot(solverConstraint.m_relpos2CrossNormal);
							btScalar fsum = btFabs(sum);
							btAssert(fsum > SIMD_EPSILON);
							solverConstraint.m_jacDiagABInv = fsum>SIMD_EPSILON?btScalar(1.)/sum : 0.f;
						}



						{
							btScalar rel_vel;
							btVector3 externalForceImpulseA = bodyAPtr->m_originalBody ? bodyAPtr->m_externalForceImpulse : btVector3(0,0,0);
							btVector3 externalTorqueImpulseA = bodyAPtr->m_originalBody ? bodyAPtr->m_externalTorqueImpulse : btVector3(0,0,0);

							btVector3 externalForceImpulseB = bodyBPtr->m_originalBody ? bodyBPtr->m_externalForceImpulse : btVector3(0,0,0);
							btVector3 externalTorqueImpulseB = bodyBPtr->m_originalBody ?bodyBPtr->m_externalTorqueImpulse : btVector3(0,0,0);

							btScalar vel1Dotn = solverConstraint.m_contactNormal1.dot(rbA.getLinearVelocity()+externalForceImpulseA)
												+ solverConstraint.m_relpos1CrossNormal.dot(rbA.getAngularVelocity()+externalTorqueImpulseA);

							btScalar vel2Dotn = solverConstraint.m_contactNormal2.dot(rbB.getLinearVelocity()+externalForceImpulseB)
																+ solverConstraint.m_relpos2CrossNormal.dot(rbB.getAngularVelocity()+externalTorqueImpulseB);

							rel_vel = vel1Dotn+vel2Dotn;
							btScalar restitution = 0.f;
							btScalar positionalError = solverConstraint.m_rhs;//already filled in by getConstraintInfo2
							btScalar	velocityError = restitution - rel_vel * info2.m_damping;
							btScalar	penetrationImpulse = positionalError*solverConstraint.m_jacDiagABInv;
							btScalar	velocityImpulse = velocityError *solverConstraint.m_jacDiagABInv;
							solverConstraint.m_rhs = penetrationImpulse+velocityImpulse;
							solverConstraint.m_appliedImpulse = 0.f;


						}
					}
				}
				currentRow+=m_tmpConstraintSizesPool[i].m_numConstraintRows;
			}
		}

		convertContacts(manifoldPtr,numManifolds,infoGlobal);

	}

//	btContactSolverInfo info = infoGlobal;


	int numNonContactPool = m_tmpSolverNonContactConstraintPool.size();
	int numConstraintPool = m_tmpSolverContactConstraintPool.size();
	int numFrictionPool = m_tmpSolverContactFrictionConstraintPool.size();

	///@todo: use stack allocator for such temporarily memory, same for solver bodies/constraints
	m_orderNonContactConstraintPool.resizeNoInitialize(numNonContactPool);
	if ((infoGlobal.m_solverMode & SOLVER_USE_2_FRICTION_DIRECTIONS))
		m_orderTmpConstraintPool.resizeNoInitialize(numConstraintPool*2);
	else
		m_orderTmpConstraintPool.resizeNoInitialize(numConstraintPool);

	m_orderFrictionConstraintPool.resizeNoInitialize(numFrictionPool);
	{
		int i;
		for (i=0;i<numNonContactPool;i++)
		{
			m_orderNonContactConstraintPool[i] = i;
		}
		for (i=0;i<numConstraintPool;i++)
		{
			m_orderTmpConstraintPool[i] = i;
		}
		for (i=0;i<numFrictionPool;i++)
		{
			m_orderFrictionConstraintPool[i] = i;
		}
	}

	return 0.f;

}